

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O0

void __thiscall
Refal2::CUnitList::HandyPrint(CUnitList *this,ostream *outputStream,CPrintHelper *printHelper)

{
  bool bVar1;
  TUnitType TVar2;
  TChar *pTVar3;
  uint *puVar4;
  ostream *poVar5;
  TNumber *pTVar6;
  CNode<Refal2::CUnit> *local_30;
  CUnitNode *node;
  bool lastWasChar;
  CPrintHelper *printHelper_local;
  ostream *outputStream_local;
  CUnitList *this_local;
  
  bVar1 = false;
  local_30 = CNodeList<Refal2::CUnit>::GetFirst(&this->super_CNodeList<Refal2::CUnit>);
  do {
    if (local_30 == (CNode<Refal2::CUnit> *)0x0) {
      if (bVar1) {
        std::operator<<(outputStream,"\'");
      }
      return;
    }
    TVar2 = CUnit::GetType(&local_30->super_CUnit);
    if (TVar2 == UT_Char) {
      if (!bVar1) {
        std::operator<<(outputStream,"\'");
        bVar1 = true;
      }
    }
    else if (bVar1) {
      std::operator<<(outputStream,"\'");
      bVar1 = false;
    }
    TVar2 = CUnit::GetType(&local_30->super_CUnit);
    if (TVar2 == UT_Char) {
      pTVar3 = CUnit::Char(&local_30->super_CUnit);
      std::operator<<(outputStream,*pTVar3);
    }
    else if (TVar2 == UT_Label) {
      std::operator<<(outputStream,"/");
      puVar4 = (uint *)CUnit::Label(&local_30->super_CUnit);
      (*printHelper->_vptr_CPrintHelper[1])(printHelper,outputStream,(ulong)*puVar4);
      std::operator<<(outputStream,"/");
    }
    else if (TVar2 == UT_Number) {
      poVar5 = std::operator<<(outputStream,"/");
      pTVar6 = CUnit::Number(&local_30->super_CUnit);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pTVar6);
      std::operator<<(poVar5,"/");
    }
    else {
      if (TVar2 == UT_Variable) {
LAB_00176f71:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                      ,0xa1,
                      "void Refal2::CUnitList::HandyPrint(std::ostream &, const CPrintHelper &) const"
                     );
      }
      if (TVar2 == UT_LeftParen) {
        std::operator<<(outputStream,"(");
      }
      else if (TVar2 == UT_RightParen) {
        std::operator<<(outputStream,")");
      }
      else if (TVar2 == UT_LeftBracket) {
        std::operator<<(outputStream,"<");
      }
      else {
        if (TVar2 != UT_RightBracket) goto LAB_00176f71;
        std::operator<<(outputStream,">");
      }
    }
    local_30 = CNode<Refal2::CUnit>::Next(local_30);
  } while( true );
}

Assistant:

void CUnitList::HandyPrint( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	bool lastWasChar = false;
	for( const CUnitNode* node = GetFirst(); node != 0; node = node->Next() ) {
		if( node->GetType() == UT_Char ) {
			if( !lastWasChar ) {
				outputStream << "'";
				lastWasChar = true;
			}
		} else {
			if( lastWasChar ) {
				outputStream << "'";
				lastWasChar = false;
			}
		}
		switch( node->GetType() ) {
			case UT_Char:
				outputStream << node->Char();
				break;
			case UT_Label:
				outputStream << "/";
				printHelper.Label( outputStream, node->Label() );
				outputStream << "/";
				break;
			case UT_Number:
				outputStream << "/" << node->Number() << "/";
				break;
			case UT_LeftParen:
				outputStream << "(";
				break;
			case UT_RightParen:
				outputStream << ")";
				break;
			case UT_LeftBracket:
				outputStream << "<";
				break;
			case UT_RightBracket:
				outputStream << ">";
				break;
			case UT_Variable:
			default:
				assert( false );
				break;
		}
	}
	if( lastWasChar ) {
		outputStream << "'";
	}
}